

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::RgbaInputFile::FromYca::readYCAScanLine(FromYca *this,int y,Rgba *buf)

{
  void *in_RDX;
  uint in_ESI;
  FromYca *in_RDI;
  int i;
  Rgba *in_stack_00000050;
  Rgba *in_stack_00000058;
  int in_stack_00000064;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar1;
  uint local_c;
  
  if ((int)in_ESI < in_RDI->_yMin) {
    local_c = in_RDI->_yMin;
  }
  else {
    local_c = in_ESI;
    if (in_RDI->_yMax < (int)in_ESI) {
      local_c = in_RDI->_yMax - 1;
    }
  }
  InputPart::readPixels
            ((InputPart *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (int)((ulong)in_RDI >> 0x20));
  if ((in_RDI->_readC & 1U) == 0) {
    for (iVar1 = 0; iVar1 < in_RDI->_width; iVar1 = iVar1 + 1) {
      Imath_3_2::half::operator=
                ((half *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),(float)((ulong)in_RDI >> 0x20));
      Imath_3_2::half::operator=
                ((half *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),(float)((ulong)in_RDI >> 0x20));
    }
  }
  if ((local_c & 1) == 0) {
    padTmpBuf(in_RDI);
    RgbaYca::reconstructChromaHoriz(in_stack_00000064,in_stack_00000058,in_stack_00000050);
  }
  else {
    memcpy(in_RDX,in_RDI->_tmpBuf + 0xd,(long)in_RDI->_width << 3);
  }
  return;
}

Assistant:

void
RgbaInputFile::FromYca::readYCAScanLine (int y, Rgba* buf)
{
    //
    // Clamp y.
    //

    if (y < _yMin)
        y = _yMin;
    else if (y > _yMax)
        y = _yMax - 1;

    //
    // Read scan line y into _tmpBuf.
    //

    _inputPart.readPixels (y);

    //
    // Reconstruct missing chroma samples and copy
    // the scan line into buf.
    //

    if (!_readC)
    {
        for (int i = 0; i < _width; ++i)
        {
            _tmpBuf[i + N2].r = 0;
            _tmpBuf[i + N2].b = 0;
        }
    }

    if (y & 1) { memcpy (buf, _tmpBuf + N2, _width * sizeof (Rgba)); }
    else
    {
        padTmpBuf ();
        reconstructChromaHoriz (_width, _tmpBuf, buf);
    }
}